

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecStr.h
# Opt level: O2

Vec_Str_t * Vec_StrStart(int nSize)

{
  int iVar1;
  Vec_Str_t *pVVar2;
  char *__s;
  
  pVVar2 = (Vec_Str_t *)malloc(0x10);
  iVar1 = 0x10;
  if (0xe < nSize - 1U) {
    iVar1 = nSize;
  }
  pVVar2->nCap = iVar1;
  if (iVar1 == 0) {
    __s = (char *)0x0;
  }
  else {
    __s = (char *)malloc((long)iVar1);
  }
  pVVar2->pArray = __s;
  pVVar2->nSize = nSize;
  memset(__s,0,(long)nSize);
  return pVVar2;
}

Assistant:

static inline Vec_Str_t * Vec_StrStart( int nSize )
{
    Vec_Str_t * p;
    p = Vec_StrAlloc( nSize );
    p->nSize = nSize;
    memset( p->pArray, 0, sizeof(char) * (size_t)nSize );
    return p;
}